

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

void (anonymous_namespace)::
     roundtrip_into<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *in,vector<int,_std::allocator<int>_> *out)

{
  Result *in_R9;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  InputStream istream;
  Result local_1c8;
  OutputStream ostream;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::detail::BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::
  serialize<OutputStream>(in,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  istream.stream = (stringstream *)std::ostream::tellp();
  local_1e0 = (long)(in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish +
              (4 - (long)(in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start);
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (&local_1c8,(Expression_lhs<unsigned_long> *)&istream,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  istream.stream = &stream;
  mserialize::detail::BuiltinDeserializer<std::vector<int,_std::allocator<int>_>,_void>::
  deserialize<InputStream>(out,&istream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void roundtrip_into(const In& in, Out& out)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // make sure computed serialized size is correct
  CHECK(std::size_t(stream.tellp()) == mserialize::serialized_size(in));

  // deserialize
  InputStream istream{stream};
  mserialize::deserialize(out, istream);
}